

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UChar * __thiscall icu_63::TZDBNames::getName(TZDBNames *this,UTimeZoneNameType type)

{
  TZDBNames *local_28;
  UChar *name;
  UTimeZoneNameType type_local;
  TZDBNames *this_local;
  
  if (this->fNames == (UChar **)0x0) {
    this_local = (TZDBNames *)0x0;
  }
  else {
    if (type == UTZNM_SHORT_STANDARD) {
      local_28 = (TZDBNames *)*this->fNames;
    }
    else if (type == UTZNM_SHORT_DAYLIGHT) {
      local_28 = (TZDBNames *)this->fNames[1];
    }
    else {
      local_28 = (TZDBNames *)0x0;
    }
    this_local = local_28;
  }
  return (UChar *)this_local;
}

Assistant:

const UChar*
TZDBNames::getName(UTimeZoneNameType type) const {
    if (fNames == NULL) {
        return NULL;
    }
    const UChar *name = NULL;
    switch(type) {
    case UTZNM_SHORT_STANDARD:
        name = fNames[0];
        break;
    case UTZNM_SHORT_DAYLIGHT:
        name = fNames[1];
        break;
    default:
        name = NULL;
    }
    return name;
}